

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O3

void Kit_SopDivideInternal
               (Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,Vec_Int_t *vMemory)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  if (cSop->nCubes < cDiv->nCubes) {
    __assert_fail("Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitSop.c"
                  ,0xb8,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (cDiv->nCubes == 1) {
    Kit_SopDivideByCube(cSop,cDiv,vQuo,vRem,vMemory);
    return;
  }
  vQuo->nCubes = 0;
  uVar12 = cSop->nCubes;
  uVar13 = (ulong)uVar12;
  uVar15 = cDiv->nCubes;
  iVar6 = 0;
  iVar5 = (int)((long)(int)uVar12 / (long)(int)uVar15);
  if (iVar5 == 0) {
LAB_00562358:
    puVar7 = (uint *)0x0;
  }
  else {
    if (iVar5 < 1) goto LAB_00562636;
    lVar10 = (long)iVar5 + (long)vMemory->nSize;
    iVar5 = (int)lVar10;
    vMemory->nSize = iVar5;
    if (vMemory->nCap < iVar5) goto LAB_00562358;
    puVar7 = (uint *)(vMemory->pArray +
                     (lVar10 - ((long)(int)uVar12 / (long)(int)uVar15 & 0xffffffffU)));
  }
  vQuo->pCubes = puVar7;
  if (0 < (int)uVar12) {
    puVar3 = cSop->pCubes;
    lVar10 = 0;
    uVar18 = (ulong)uVar15;
LAB_005623a1:
    uVar12 = (uint)uVar13;
    uVar9 = puVar3[lVar10];
    if (uVar9 != 0) {
      if (-1 < (int)uVar9) {
        iVar6 = (int)uVar18;
        if (0 < iVar6) {
          uVar14 = 0;
          do {
            if ((cDiv->pCubes[uVar14] & ~uVar9) == 0) {
              if (iVar6 != (int)uVar14) {
                uVar17 = ~cDiv->pCubes[uVar14] & uVar9;
                if (iVar6 < 1) goto LAB_00562465;
                uVar16 = 0;
                goto LAB_00562414;
              }
              break;
            }
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
          goto LAB_00562538;
        }
        uVar17 = 0;
        if (uVar18 == 0) {
          uVar18 = 0;
          goto LAB_00562538;
        }
        uVar14 = 0;
LAB_00562465:
        uVar16 = 0;
LAB_00562468:
        if ((int)uVar16 != iVar6) goto LAB_00562538;
        goto LAB_00562471;
      }
      goto LAB_00562538;
    }
    goto LAB_00562548;
  }
LAB_0056255b:
  uVar9 = 0;
  vRem->nCubes = 0;
  uVar12 = uVar12 - uVar15 * iVar6;
  if (uVar12 != 0) {
    if ((int)uVar12 < 1) {
LAB_00562636:
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x39a,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar10 = (long)(int)uVar12 + (long)vMemory->nSize;
    iVar6 = (int)lVar10;
    vMemory->nSize = iVar6;
    if (iVar6 <= vMemory->nCap) {
      puVar7 = (uint *)(vMemory->pArray + (lVar10 - (ulong)uVar12));
      goto LAB_0056259f;
    }
  }
  puVar7 = (uint *)0x0;
LAB_0056259f:
  vRem->pCubes = puVar7;
  if (0 < cSop->nCubes) {
    puVar3 = cSop->pCubes;
    lVar10 = 0;
    do {
      uVar15 = puVar3[lVar10];
      if (uVar15 == 0) break;
      if ((int)uVar15 < 0) {
        puVar3[lVar10] = uVar15 & 0x7fffffff;
      }
      else {
        iVar6 = vRem->nCubes;
        vRem->nCubes = iVar6 + 1;
        puVar7[iVar6] = uVar15;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < cSop->nCubes);
    uVar9 = vRem->nCubes;
  }
  if (uVar12 != uVar9) {
    __assert_fail("nCubesRem == Kit_SopCubeNum(vRem)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitSop.c"
                  ,0x114,
                  "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  return;
LAB_00562414:
  do {
    uVar1 = cDiv->pCubes[uVar16];
    if (uVar1 == 0) goto LAB_00562468;
    if (uVar14 != uVar16) {
      if ((int)uVar12 < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        while( true ) {
          uVar2 = puVar3[uVar11];
          if ((uVar2 == 0) ||
             (((-1 < (int)uVar2 && ((uVar2 & uVar1) == uVar1)) && (uVar17 == (uVar2 & ~uVar1)))))
          break;
          uVar11 = uVar11 + 1;
          if ((uVar13 & 0xffffffff) == uVar11) goto LAB_00562468;
        }
      }
      if ((uint)uVar11 == uVar12) goto LAB_00562468;
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != uVar18);
LAB_00562471:
  iVar6 = vQuo->nCubes;
  vQuo->nCubes = iVar6 + 1;
  puVar7[iVar6] = uVar17;
  puVar3[lVar10] = uVar9 | 0x80000000;
  uVar15 = cDiv->nCubes;
  if ((int)uVar15 < 1) {
LAB_00562530:
    uVar18 = (ulong)uVar15;
  }
  else {
    puVar4 = cDiv->pCubes;
    uVar13 = 0;
    do {
      uVar12 = puVar4[uVar13];
      if (uVar12 == 0) goto LAB_00562530;
      if (uVar13 != (uVar14 & 0xffffffff)) {
        if ((long)cSop->nCubes < 1) {
LAB_005625f8:
          __assert_fail("i2 < Kit_SopCubeNum(cSop)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitSop.c"
                        ,0xfe,
                        "void Kit_SopDivideInternal(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                       );
        }
        lVar8 = 0;
        while( true ) {
          uVar15 = puVar3[lVar8];
          if ((uVar15 == 0) ||
             (((-1 < (int)uVar15 && ((uVar15 & uVar12) == uVar12)) && (uVar17 == (uVar15 & ~uVar12))
              ))) break;
          lVar8 = lVar8 + 1;
          if (cSop->nCubes == lVar8) goto LAB_005625f8;
        }
        puVar3[lVar8] = uVar15 | 0x80000000;
        uVar15 = cDiv->nCubes;
      }
      uVar13 = uVar13 + 1;
      uVar18 = (ulong)uVar15;
    } while ((long)uVar13 < (long)(int)uVar15);
  }
LAB_00562538:
  lVar10 = lVar10 + 1;
  uVar12 = cSop->nCubes;
  uVar13 = (ulong)(int)uVar12;
  if ((long)uVar13 <= lVar10) goto LAB_00562548;
  goto LAB_005623a1;
LAB_00562548:
  iVar6 = vQuo->nCubes;
  goto LAB_0056255b;
}

Assistant:

void Kit_SopDivideInternal( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    unsigned uCube2 = 0; // Suppress "might be used uninitialized"
    unsigned uDiv2, uQuo;
    int i, i2, k, k2, nCubesRem;
    assert( Kit_SopCubeNum(cSop) >= Kit_SopCubeNum(cDiv) );
    // consider special case
    if ( Kit_SopCubeNum(cDiv) == 1 )
    {
        Kit_SopDivideByCube( cSop, cDiv, vQuo, vRem, vMemory );
        return;
    }
    // allocate quotient
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) / Kit_SopCubeNum(cDiv) );
    // for each cube of the cover
    // it either belongs to the quotient or to the remainder
    Kit_SopForEachCube( cSop, uCube, i )
    {
        // skip taken cubes
        if ( Kit_CubeIsMarked(uCube) )
            continue;
        // find a matching cube in the divisor
        uDiv = ~0;
        Kit_SopForEachCube( cDiv, uDiv, k )
            if ( Kit_CubeContains( uCube, uDiv ) )
                break;
        // the cube is not found 
        if ( k == Kit_SopCubeNum(cDiv) )
            continue;
        // the quotient cube exists
        uQuo = Kit_CubeSharp( uCube, uDiv );
        // find corresponding cubes for other cubes of the divisor
        uDiv2 = ~0;
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            // the case when the cube is not found
            if ( i2 == Kit_SopCubeNum(cSop) )
                break;
        }
        // we did not find some cubes - continue looking at other cubes
        if ( k2 != Kit_SopCubeNum(cDiv) )
            continue;
        // we found all cubes - add the quotient cube
        Kit_SopPushCube( vQuo, uQuo );

        // mark the first cube
        Kit_SopWriteCube( cSop, Kit_CubeMark(uCube), i );
        // mark other cubes that have this quotient
        Kit_SopForEachCube( cDiv, uDiv2, k2 )
        {
            if ( k2 == k )
                continue;
            // find a matching cube
            Kit_SopForEachCube( cSop, uCube2, i2 )
            {
                // skip taken cubes
                if ( Kit_CubeIsMarked(uCube2) )
                    continue;
                // check if the cube can be used
                if ( Kit_CubeContains( uCube2, uDiv2 ) && uQuo == Kit_CubeSharp( uCube2, uDiv2 ) )
                    break;
            }
            assert( i2 < Kit_SopCubeNum(cSop) );
            // the cube is found, mark it 
            // (later we will add all unmarked cubes to the remainder)
            Kit_SopWriteCube( cSop, Kit_CubeMark(uCube2), i2 );
        }
    }
    // determine the number of cubes in the remainder
    nCubesRem = Kit_SopCubeNum(cSop) - Kit_SopCubeNum(vQuo) * Kit_SopCubeNum(cDiv);
    // allocate remainder
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, nCubesRem );
    // finally add the remaining unmarked cubes to the remainder 
    // and clean the marked cubes in the cover
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( !Kit_CubeIsMarked(uCube) )
        {
            Kit_SopPushCube( vRem, uCube );
            continue;
        }
        Kit_SopWriteCube( cSop, Kit_CubeUnmark(uCube), i );
    }
    assert( nCubesRem == Kit_SopCubeNum(vRem) );
}